

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

void __thiscall libtorrent::aux::torrent::set_apply_ip_filter(torrent *this,bool b)

{
  byte bVar1;
  int iVar2;
  undefined4 extraout_var;
  
  if (((this->field_0x5db & 2) == 0) != b) {
    return;
  }
  iVar2 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [0x4b])();
  counters::inc_stats_counter((counters *)CONCAT44(extraout_var,iVar2),0xdb,-(ulong)b | 1);
  bVar1 = (this->m_need_save_resume_data).m_val;
  if ((bVar1 & 0x20) == 0) {
    (this->m_need_save_resume_data).m_val = bVar1 | 0x20;
    state_updated(this);
  }
  *(uint *)&this->field_0x5d8 = *(uint *)&this->field_0x5d8 & 0xfdffffff | (uint)b << 0x19;
  ip_filter_updated(this);
  state_updated(this);
  return;
}

Assistant:

void torrent::set_apply_ip_filter(bool b)
	{
		if (b == m_apply_ip_filter) return;
		if (b)
		{
			inc_stats_counter(counters::non_filter_torrents, -1);
		}
		else
		{
			inc_stats_counter(counters::non_filter_torrents);
		}

		set_need_save_resume(torrent_handle::if_config_changed);

		m_apply_ip_filter = b;
		ip_filter_updated();
		state_updated();
	}